

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  xpath_ast_node *pxVar1;
  char cVar2;
  bool bVar3;
  int i;
  byte *pbVar4;
  long lVar5;
  char_t *__dest;
  char *pcVar6;
  xpath_ast_node *pxVar7;
  char cVar8;
  byte bVar9;
  ulong uVar10;
  xpath_ast_node **ppxVar11;
  char local_98 [128];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  ppxVar11 = &this->_right;
  bVar9 = this->_type;
  if ((bVar9 & 0xfe) != 0x10) {
    if (bVar9 == 0x2c) {
      pxVar7 = *ppxVar11;
      if (pxVar7 == (xpath_ast_node *)0x0) {
        return;
      }
      if (pxVar7->_type != '\x12') {
        return;
      }
      if (pxVar7->_next->_type != '\x12') {
        return;
      }
      pbVar4 = (byte *)(pxVar7->_data).string;
      pcVar6 = (pxVar7->_next->_data).string;
      local_98[0x70] = '\0';
      local_98[0x71] = '\0';
      local_98[0x72] = '\0';
      local_98[0x73] = '\0';
      local_98[0x74] = '\0';
      local_98[0x75] = '\0';
      local_98[0x76] = '\0';
      local_98[0x77] = '\0';
      local_98[0x78] = '\0';
      local_98[0x79] = '\0';
      local_98[0x7a] = '\0';
      local_98[0x7b] = '\0';
      local_98[0x7c] = '\0';
      local_98[0x7d] = '\0';
      local_98[0x7e] = '\0';
      local_98[0x7f] = '\0';
      local_98[0x60] = '\0';
      local_98[0x61] = '\0';
      local_98[0x62] = '\0';
      local_98[99] = '\0';
      local_98[100] = '\0';
      local_98[0x65] = '\0';
      local_98[0x66] = '\0';
      local_98[0x67] = '\0';
      local_98[0x68] = '\0';
      local_98[0x69] = '\0';
      local_98[0x6a] = '\0';
      local_98[0x6b] = '\0';
      local_98[0x6c] = '\0';
      local_98[0x6d] = '\0';
      local_98[0x6e] = '\0';
      local_98[0x6f] = '\0';
      local_98[0x50] = '\0';
      local_98[0x51] = '\0';
      local_98[0x52] = '\0';
      local_98[0x53] = '\0';
      local_98[0x54] = '\0';
      local_98[0x55] = '\0';
      local_98[0x56] = '\0';
      local_98[0x57] = '\0';
      local_98[0x58] = '\0';
      local_98[0x59] = '\0';
      local_98[0x5a] = '\0';
      local_98[0x5b] = '\0';
      local_98[0x5c] = '\0';
      local_98[0x5d] = '\0';
      local_98[0x5e] = '\0';
      local_98[0x5f] = '\0';
      local_98[0x40] = '\0';
      local_98[0x41] = '\0';
      local_98[0x42] = '\0';
      local_98[0x43] = '\0';
      local_98[0x44] = '\0';
      local_98[0x45] = '\0';
      local_98[0x46] = '\0';
      local_98[0x47] = '\0';
      local_98[0x48] = '\0';
      local_98[0x49] = '\0';
      local_98[0x4a] = '\0';
      local_98[0x4b] = '\0';
      local_98[0x4c] = '\0';
      local_98[0x4d] = '\0';
      local_98[0x4e] = '\0';
      local_98[0x4f] = '\0';
      local_98[0x30] = '\0';
      local_98[0x31] = '\0';
      local_98[0x32] = '\0';
      local_98[0x33] = '\0';
      local_98[0x34] = '\0';
      local_98[0x35] = '\0';
      local_98[0x36] = '\0';
      local_98[0x37] = '\0';
      local_98[0x38] = '\0';
      local_98[0x39] = '\0';
      local_98[0x3a] = '\0';
      local_98[0x3b] = '\0';
      local_98[0x3c] = '\0';
      local_98[0x3d] = '\0';
      local_98[0x3e] = '\0';
      local_98[0x3f] = '\0';
      local_98[0x20] = '\0';
      local_98[0x21] = '\0';
      local_98[0x22] = '\0';
      local_98[0x23] = '\0';
      local_98[0x24] = '\0';
      local_98[0x25] = '\0';
      local_98[0x26] = '\0';
      local_98[0x27] = '\0';
      local_98[0x28] = '\0';
      local_98[0x29] = '\0';
      local_98[0x2a] = '\0';
      local_98[0x2b] = '\0';
      local_98[0x2c] = '\0';
      local_98[0x2d] = '\0';
      local_98[0x2e] = '\0';
      local_98[0x2f] = '\0';
      local_98[0x10] = '\0';
      local_98[0x11] = '\0';
      local_98[0x12] = '\0';
      local_98[0x13] = '\0';
      local_98[0x14] = '\0';
      local_98[0x15] = '\0';
      local_98[0x16] = '\0';
      local_98[0x17] = '\0';
      local_98[0x18] = '\0';
      local_98[0x19] = '\0';
      local_98[0x1a] = '\0';
      local_98[0x1b] = '\0';
      local_98[0x1c] = '\0';
      local_98[0x1d] = '\0';
      local_98[0x1e] = '\0';
      local_98[0x1f] = '\0';
      local_98[0] = '\0';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      while( true ) {
        uVar10 = (ulong)*pbVar4;
        if (uVar10 == 0) break;
        bVar9 = 0x2c;
        if (((char)*pbVar4 < '\0') || (cVar2 = *pcVar6, cVar2 < '\0')) goto LAB_00116216;
        if (local_98[uVar10] == '\0') {
          cVar8 = cVar2;
          if (cVar2 == '\0') {
            cVar8 = -0x80;
          }
          local_98[uVar10] = cVar8;
        }
        pbVar4 = pbVar4 + 1;
        pcVar6 = pcVar6 + (cVar2 != '\0');
      }
      for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
        if (local_98[lVar5] == '\0') {
          local_98[lVar5] = (char)lVar5;
        }
      }
      __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
      if (__dest != (char_t *)0x0) {
        memcpy(__dest,local_98,0x80);
        this->_type = ':';
        (this->_data).string = __dest;
        return;
      }
      bVar9 = this->_type;
    }
    else if (bVar9 == 0x38) {
      bVar9 = this->_axis;
      if (0xc < bVar9) {
        return;
      }
      if ((0x1038U >> (bVar9 & 0x1f) & 1) == 0) {
        return;
      }
      pxVar7 = this->_left;
      if (pxVar7 == (xpath_ast_node *)0x0) {
        return;
      }
      if (pxVar7->_type != '8') {
        return;
      }
      if (pxVar7->_axis != '\x05') {
        return;
      }
      if (pxVar7->_test != '\x02') {
        return;
      }
      if (pxVar7->_right != (xpath_ast_node *)0x0) {
        return;
      }
      do {
        pxVar1 = *ppxVar11;
        if (pxVar1 == (xpath_ast_node *)0x0) {
          this->_axis = (byte)(bVar9 - 3) < 2 ^ 5;
          this->_left = pxVar7->_left;
          return;
        }
        ppxVar11 = &pxVar1->_next;
      } while (pxVar1->_test == '\x01');
      return;
    }
LAB_00116216:
    if (bVar9 != 3) {
      return;
    }
    pxVar7 = this->_left;
    if (pxVar7 == (xpath_ast_node *)0x0) {
      return;
    }
    pxVar1 = *ppxVar11;
    if (pxVar1 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar7->_type != '8') {
      return;
    }
    if (pxVar7->_axis != '\x02') {
      return;
    }
    if (pxVar7->_test != '\x01') {
      return;
    }
    if (pxVar7->_left != (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar7->_right != (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar1->_type != '\x12') {
      if (pxVar1->_type != '\x14') {
        return;
      }
      if (pxVar1->_rettype != '\x03') {
        return;
      }
    }
    this->_type = ';';
    return;
  }
  pxVar7 = *ppxVar11;
  if (pxVar7 == (xpath_ast_node *)0x0) {
    return;
  }
  cVar2 = pxVar7->_type;
  if (cVar2 == '\x03') {
    cVar2 = '\x03';
    if ((pxVar7->_left->_type != '\x16') || (pxVar1 = pxVar7->_right, pxVar1->_rettype != '\x02'))
    goto LAB_0011619e;
    *ppxVar11 = pxVar1;
    cVar2 = pxVar1->_type;
    pxVar7 = pxVar1;
  }
  if (cVar2 == '\x13') {
    if (((pxVar7->_data).number == 1.0) && (!NAN((pxVar7->_data).number))) {
      this->_test = '\x03';
      return;
    }
    cVar2 = '\x13';
  }
LAB_0011619e:
  if (pxVar7->_rettype == '\x02') {
    if ((byte)(cVar2 - 0x13U) < 3) {
      this->_test = '\x02';
    }
  }
  else {
    bVar3 = is_posinv_expr(pxVar7);
    if (bVar3) {
      this->_test = '\x01';
    }
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}